

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execBitImEa<(moira::Instr)34,(moira::Mode)4,(moira::Size)1>(Moira *this,u16 opcode)

{
  int *piVar1;
  u16 uVar2;
  u32 uVar3;
  uint n;
  
  uVar2 = (this->queue).irc;
  readExt(this);
  n = opcode & 7;
  uVar3 = computeEA<(moira::Mode)4,(moira::Size)1,0ul>(this,n);
  uVar3 = readM<(moira::MemSpace)1,(moira::Size)1,0ul>(this,uVar3);
  piVar1 = (int *)((long)this->exec + (ulong)n * 4 + -0x38);
  *piVar1 = *piVar1 + (-1 - (uint)((~(uint)opcode & 7) == 0));
  (this->reg).sr.z = (uVar3 >> ((byte)uVar2 & 7) & 1) == 0;
  uVar3 = (this->reg).pc;
  (this->reg).pc0 = uVar3;
  (this->queue).ird = (this->queue).irc;
  uVar3 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar3 + 2);
  (this->queue).irc = (u16)uVar3;
  return;
}

Assistant:

void
Moira::execBitImEa(u16 opcode)
{
    u8  src = readI<S>();
    int dst = _____________xxx(opcode);

    switch (M)
    {
        case 0:
        {
            src &= 0b11111;
            u32 data = readD(dst);
            data = bit<I>(data, src);

            prefetch<POLLIPL>();

            sync(cyclesBit<I>(src));
            if (I != BTST) writeD(dst, data);
            break;
        }
        default:
        {
            src &= 0b111;
            u32 ea, data;
            if (!readOp<M,S>(dst, ea, data)) return;

            data = bit<I>(data, src);

            if (I != BTST) {
                prefetch();
                writeM <M, S, POLLIPL> (ea, data);
            } else {
                prefetch<POLLIPL>();
            }
        }
    }
}